

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

cjpeg_source_ptr jinit_read_gif(j_compress_ptr cinfo)

{
  cjpeg_source_ptr pcVar1;
  _func_void_j_compress_ptr_cjpeg_source_ptr *in_RDI;
  gif_source_ptr source;
  
  pcVar1 = (cjpeg_source_ptr)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x1b8);
  pcVar1[1].start_input = in_RDI;
  pcVar1->start_input = start_input_gif;
  pcVar1->finish_input = finish_input_gif;
  return pcVar1;
}

Assistant:

GLOBAL(cjpeg_source_ptr)
jinit_read_gif(j_compress_ptr cinfo)
{
  gif_source_ptr source;

  /* Create module interface object */
  source = (gif_source_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(gif_source_struct));
  source->cinfo = cinfo;        /* make back link for subroutines */
  /* Fill in method ptrs, except get_pixel_rows which start_input sets */
  source->pub.start_input = start_input_gif;
  source->pub.finish_input = finish_input_gif;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  source->pub.max_pixels = 0;
#endif

  return (cjpeg_source_ptr)source;
}